

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O2

void expandChallenge(uint16_t *challengeC,uint16_t *challengeP,uint8_t *sigH,
                    picnic_instance_t *params)

{
  ushort *puVar1;
  byte bVar2;
  ushort uVar3;
  byte bVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  uint8_t uVar8;
  ulong extraout_RDX;
  ulong uVar9;
  ulong extraout_RDX_00;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint8_t h [64];
  uint16_t chunks [128];
  hash_context ctx;
  
  h[0] = '\0';
  h[1] = '\0';
  h[2] = '\0';
  h[3] = '\0';
  h[4] = '\0';
  h[5] = '\0';
  h[6] = '\0';
  h[7] = '\0';
  h[8] = '\0';
  h[9] = '\0';
  h[10] = '\0';
  h[0xb] = '\0';
  h[0xc] = '\0';
  h[0xd] = '\0';
  h[0xe] = '\0';
  h[0xf] = '\0';
  h[0x10] = '\0';
  h[0x11] = '\0';
  h[0x12] = '\0';
  h[0x13] = '\0';
  h[0x14] = '\0';
  h[0x15] = '\0';
  h[0x16] = '\0';
  h[0x17] = '\0';
  h[0x18] = '\0';
  h[0x19] = '\0';
  h[0x1a] = '\0';
  h[0x1b] = '\0';
  h[0x1c] = '\0';
  h[0x1d] = '\0';
  h[0x1e] = '\0';
  h[0x1f] = '\0';
  h[0x20] = '\0';
  h[0x21] = '\0';
  h[0x22] = '\0';
  h[0x23] = '\0';
  h[0x24] = '\0';
  h[0x25] = '\0';
  h[0x26] = '\0';
  h[0x27] = '\0';
  h[0x28] = '\0';
  h[0x29] = '\0';
  h[0x2a] = '\0';
  h[0x2b] = '\0';
  h[0x2c] = '\0';
  h[0x2d] = '\0';
  h[0x2e] = '\0';
  h[0x2f] = '\0';
  h[0x30] = '\0';
  h[0x31] = '\0';
  h[0x32] = '\0';
  h[0x33] = '\0';
  h[0x34] = '\0';
  h[0x35] = '\0';
  h[0x36] = '\0';
  h[0x37] = '\0';
  h[0x38] = '\0';
  h[0x39] = '\0';
  h[0x3a] = '\0';
  h[0x3b] = '\0';
  h[0x3c] = '\0';
  h[0x3d] = '\0';
  h[0x3e] = '\0';
  h[0x3f] = '\0';
  memcpy(h,sigH,(ulong)params->digest_size);
  bVar2 = params->num_MPC_parties;
  uVar13 = (ulong)(0x20 - LZCOUNT(params->num_rounds - 1));
  if (params->num_rounds == 0) {
    uVar13 = 0;
  }
  chunks[0x60] = 0;
  chunks[0x61] = 0;
  chunks[0x62] = 0;
  chunks[99] = 0;
  chunks[100] = 0;
  chunks[0x65] = 0;
  chunks[0x66] = 0;
  chunks[0x67] = 0;
  chunks[0x68] = 0;
  chunks[0x69] = 0;
  chunks[0x6a] = 0;
  chunks[0x6b] = 0;
  chunks[0x6c] = 0;
  chunks[0x6d] = 0;
  chunks[0x6e] = 0;
  chunks[0x6f] = 0;
  chunks[0x70] = 0;
  chunks[0x71] = 0;
  chunks[0x72] = 0;
  chunks[0x73] = 0;
  chunks[0x74] = 0;
  chunks[0x75] = 0;
  chunks[0x76] = 0;
  chunks[0x77] = 0;
  chunks[0x78] = 0;
  chunks[0x79] = 0;
  chunks[0x7a] = 0;
  chunks[0x7b] = 0;
  chunks[0x7c] = 0;
  chunks[0x7d] = 0;
  chunks[0x7e] = 0;
  chunks[0x7f] = 0;
  chunks[0x40] = 0;
  chunks[0x41] = 0;
  chunks[0x42] = 0;
  chunks[0x43] = 0;
  chunks[0x44] = 0;
  chunks[0x45] = 0;
  chunks[0x46] = 0;
  chunks[0x47] = 0;
  chunks[0x48] = 0;
  chunks[0x49] = 0;
  chunks[0x4a] = 0;
  chunks[0x4b] = 0;
  chunks[0x4c] = 0;
  chunks[0x4d] = 0;
  chunks[0x4e] = 0;
  chunks[0x4f] = 0;
  chunks[0x50] = 0;
  chunks[0x51] = 0;
  chunks[0x52] = 0;
  chunks[0x53] = 0;
  chunks[0x54] = 0;
  chunks[0x55] = 0;
  chunks[0x56] = 0;
  chunks[0x57] = 0;
  chunks[0x58] = 0;
  chunks[0x59] = 0;
  chunks[0x5a] = 0;
  chunks[0x5b] = 0;
  chunks[0x5c] = 0;
  chunks[0x5d] = 0;
  chunks[0x5e] = 0;
  chunks[0x5f] = 0;
  chunks[0x20] = 0;
  chunks[0x21] = 0;
  chunks[0x22] = 0;
  chunks[0x23] = 0;
  chunks[0x24] = 0;
  chunks[0x25] = 0;
  chunks[0x26] = 0;
  chunks[0x27] = 0;
  chunks[0x28] = 0;
  chunks[0x29] = 0;
  chunks[0x2a] = 0;
  chunks[0x2b] = 0;
  chunks[0x2c] = 0;
  chunks[0x2d] = 0;
  chunks[0x2e] = 0;
  chunks[0x2f] = 0;
  chunks[0x30] = 0;
  chunks[0x31] = 0;
  chunks[0x32] = 0;
  chunks[0x33] = 0;
  chunks[0x34] = 0;
  chunks[0x35] = 0;
  chunks[0x36] = 0;
  chunks[0x37] = 0;
  chunks[0x38] = 0;
  chunks[0x39] = 0;
  chunks[0x3a] = 0;
  chunks[0x3b] = 0;
  chunks[0x3c] = 0;
  chunks[0x3d] = 0;
  chunks[0x3e] = 0;
  chunks[0x3f] = 0;
  chunks[0] = 0;
  chunks[1] = 0;
  chunks[2] = 0;
  chunks[3] = 0;
  chunks[4] = 0;
  chunks[5] = 0;
  chunks[6] = 0;
  chunks[7] = 0;
  chunks[8] = 0;
  chunks[9] = 0;
  chunks[10] = 0;
  chunks[0xb] = 0;
  chunks[0xc] = 0;
  chunks[0xd] = 0;
  chunks[0xe] = 0;
  chunks[0xf] = 0;
  chunks[0x10] = 0;
  chunks[0x11] = 0;
  chunks[0x12] = 0;
  chunks[0x13] = 0;
  chunks[0x14] = 0;
  chunks[0x15] = 0;
  chunks[0x16] = 0;
  chunks[0x17] = 0;
  chunks[0x18] = 0;
  chunks[0x19] = 0;
  chunks[0x1a] = 0;
  chunks[0x1b] = 0;
  chunks[0x1c] = 0;
  chunks[0x1d] = 0;
  chunks[0x1e] = 0;
  chunks[0x1f] = 0;
  uVar12 = 0;
  do {
    bVar4 = params->num_opened_rounds;
    uVar10 = (ulong)bVar4;
    if (uVar10 <= uVar12) {
      uVar13 = 0;
      sVar5 = (ulong)(0x20 - LZCOUNT(bVar2 - 1));
      if (bVar2 == 0) {
        sVar5 = uVar13;
      }
      do {
        uVar12 = (ulong)bVar4;
        if (uVar12 <= uVar13) {
          return;
        }
        bVar2 = params->digest_size;
        sVar6 = bitsToChunks(sVar5,h,(ulong)bVar2,chunks);
        sVar7 = 0;
        uVar10 = extraout_RDX_00;
        do {
          uVar8 = (uint8_t)uVar10;
          uVar9 = uVar13;
          if (sVar6 == sVar7) break;
          uVar3 = chunks[sVar7];
          uVar10 = (ulong)uVar3;
          uVar8 = (uint8_t)uVar3;
          if (uVar3 < params->num_MPC_parties) {
            challengeP[uVar13] = uVar3;
            uVar13 = uVar13 + 1;
          }
          sVar7 = sVar7 + 1;
          uVar9 = uVar12;
        } while (uVar13 != uVar12);
        hash_init_prefix(&ctx,(ulong)bVar2,uVar8);
        hash_update(&ctx,h,(ulong)params->digest_size);
        hash_final(&ctx);
        hash_squeeze(&ctx,h,(ulong)params->digest_size);
        bVar4 = params->num_opened_rounds;
        uVar13 = uVar9;
      } while( true );
    }
    bVar4 = params->digest_size;
    sVar5 = bitsToChunks(uVar13,h,(ulong)bVar4,chunks);
    sVar6 = 0;
    uVar9 = extraout_RDX;
    do {
      uVar8 = (uint8_t)uVar9;
      uVar11 = uVar12;
      if (sVar6 == sVar5) break;
      uVar3 = chunks[sVar6];
      uVar9 = (ulong)uVar3;
      uVar8 = (uint8_t)uVar3;
      if (uVar3 < params->num_rounds) {
        if (uVar12 == 0) {
          *challengeC = uVar3;
          uVar12 = 1;
        }
        else {
          uVar11 = 0;
          do {
            if (uVar12 == uVar11) {
              challengeC[uVar12] = uVar3;
              uVar12 = uVar12 + 1;
              break;
            }
            puVar1 = challengeC + uVar11;
            uVar11 = uVar11 + 1;
          } while (*puVar1 != uVar3);
        }
      }
      sVar6 = sVar6 + 1;
      uVar11 = uVar10;
    } while (uVar12 != uVar10);
    hash_init_prefix(&ctx,(ulong)bVar4,uVar8);
    hash_update(&ctx,h,(ulong)params->digest_size);
    hash_final(&ctx);
    hash_squeeze(&ctx,h,(ulong)params->digest_size);
    uVar12 = uVar11;
  } while( true );
}

Assistant:

static void expandChallenge(uint16_t* challengeC, uint16_t* challengeP, const uint8_t* sigH,
                            const picnic_instance_t* params) {
  uint8_t h[MAX_DIGEST_SIZE] = {0};
  hash_context ctx;

  memcpy(h, sigH, params->digest_size);
  // Populate C
  uint32_t bitsPerChunkC = ceil_log2(params->num_rounds);
  uint32_t bitsPerChunkP = ceil_log2(params->num_MPC_parties);
  assert(bitsPerChunkC >= 4);
  assert(bitsPerChunkP >= 4);
  // chunks would only require digest_size * 8 / min(bitsPerChunkC, bitsPerChunkP), but
  // bitsPerChunkP is always 4 and the minimum.
  uint16_t chunks[MAX_DIGEST_SIZE * 8 / 4] = {0};

  size_t countC = 0;
  while (countC < params->num_opened_rounds) {
    size_t numChunks = bitsToChunks(bitsPerChunkC, h, params->digest_size, chunks);
    for (size_t i = 0; i < numChunks; i++) {
      if (chunks[i] < params->num_rounds) {
        countC = appendUnique(challengeC, chunks[i], countC);
      }
      if (countC == params->num_opened_rounds) {
        break;
      }
    }

    hash_init_prefix(&ctx, params->digest_size, HASH_PREFIX_1);
    hash_update(&ctx, h, params->digest_size);
    hash_final(&ctx);
    hash_squeeze(&ctx, h, params->digest_size);
    hash_clear(&ctx);
  }

  // Note that we always compute h = H(h) after setting C
  size_t countP = 0;

  while (countP < params->num_opened_rounds) {
    size_t numChunks = bitsToChunks(bitsPerChunkP, h, params->digest_size, chunks);
    for (size_t i = 0; i < numChunks; i++) {
      if (chunks[i] < params->num_MPC_parties) {
        challengeP[countP] = chunks[i];
        countP++;
      }
      if (countP == params->num_opened_rounds) {
        break;
      }
    }

    hash_init_prefix(&ctx, params->digest_size, HASH_PREFIX_1);
    hash_update(&ctx, h, params->digest_size);
    hash_final(&ctx);
    hash_squeeze(&ctx, h, params->digest_size);
    hash_clear(&ctx);
  }
}